

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenIndex
BinaryenCallIndirectAppendOperand(BinaryenExpressionRef expr,BinaryenExpressionRef operandExpr)

{
  Id IVar1;
  
  if (expr->_id != CallIndirectId) {
    __assert_fail("expression->is<CallIndirect>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x940,
                  "BinaryenIndex BinaryenCallIndirectAppendOperand(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (operandExpr != (BinaryenExpressionRef)0x0) {
    IVar1 = expr[2]._id;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)&expr[1].type
               ,operandExpr);
    return IVar1;
  }
  __assert_fail("operandExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x941,
                "BinaryenIndex BinaryenCallIndirectAppendOperand(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

BinaryenIndex
BinaryenCallIndirectAppendOperand(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef operandExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<CallIndirect>());
  assert(operandExpr);
  auto& list = static_cast<CallIndirect*>(expression)->operands;
  auto index = list.size();
  list.push_back((Expression*)operandExpr);
  return index;
}